

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O0

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_a8 [8];
  uv_getaddrinfo_t req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,(uv_getaddrinfo_t *)local_a8,(uv_getaddrinfo_cb)0x0,name,(char *)0x0
                         ,(addrinfo *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x9a,"0 == uv_getaddrinfo(uv_default_loop(), &req, NULL, name, NULL, NULL)");
    abort();
  }
  uv_freeaddrinfo((addrinfo *)req.service);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
            ,0x9d,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
  uv_getaddrinfo_t req;

  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             NULL,
                             name,
                             NULL,
                             NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}